

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O2

Vec_Int_t * Seg_ManCountIntEdges(Gia_Man_t *p,Vec_Int_t *vPolars,Vec_Int_t *vToSkip,int nFanouts)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  long lVar5;
  int Id;
  
  p_00 = Vec_IntAlloc(1000);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                  ,0x53,
                  "Vec_Int_t *Seg_ManCountIntEdges(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  vPolars->nSize = 0;
  vToSkip->nSize = 0;
  if (nFanouts != 0) {
    Gia_ManSetLutRefs(p);
  }
  Id = 1;
  do {
    if (p->nObjs <= Id) {
      if ((nFanouts != 0) && (p->pLutRefs != (int *)0x0)) {
        free(p->pLutRefs);
        p->pLutRefs = (int *)0x0;
      }
      return p_00;
    }
    iVar1 = Gia_ObjIsLut(p,Id);
    if (iVar1 != 0) {
      lVar5 = 0;
      while( true ) {
        iVar1 = Gia_ObjLutSize(p,Id);
        if (iVar1 <= lVar5) break;
        piVar3 = Gia_ObjLutFanins(p,Id);
        iVar1 = piVar3[lVar5];
        pGVar4 = Gia_ManObj(p,iVar1);
        if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
          if (p->vEdge1 != (Vec_Int_t *)0x0) {
            iVar2 = Gia_ObjCheckEdge(p,iVar1,Id);
            if (iVar2 != 0) {
              Vec_IntPush(vPolars,p_00->nSize / 2);
            }
          }
          if (nFanouts != 0) {
            if (p->pLutRefs == (int *)0x0) {
              __assert_fail("p->pLutRefs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x233,"int Gia_ObjLutRefNumId(Gia_Man_t *, int)");
            }
            if (nFanouts <= p->pLutRefs[iVar1]) {
              Vec_IntPush(vToSkip,p_00->nSize / 2);
            }
          }
          Vec_IntPushTwo(p_00,iVar1,Id);
        }
        lVar5 = lVar5 + 1;
      }
    }
    Id = Id + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Seg_ManCountIntEdges( Gia_Man_t * p, Vec_Int_t * vPolars, Vec_Int_t * vToSkip, int nFanouts )
{
    int i, iLut, iFanin;
    Vec_Int_t * vEdges = Vec_IntAlloc( 1000 );
    assert( Gia_ManHasMapping(p) );
    Vec_IntClear( vPolars );
    Vec_IntClear( vToSkip );
    if ( nFanouts )
        Gia_ManSetLutRefs( p );
    Gia_ManForEachLut( p, iLut )
        Gia_LutForEachFanin( p, iLut, iFanin, i )
            if ( Gia_ObjIsAnd(Gia_ManObj(p, iFanin)) )
            {
                if ( p->vEdge1 && Gia_ObjCheckEdge(p, iFanin, iLut) )
                    Vec_IntPush( vPolars, Vec_IntSize(vEdges)/2 );
                if ( nFanouts && Gia_ObjLutRefNumId(p, iFanin) >= nFanouts )
                    Vec_IntPush( vToSkip, Vec_IntSize(vEdges)/2 );
                Vec_IntPushTwo( vEdges, iFanin, iLut );
            }
    if ( nFanouts )
        ABC_FREE( p->pLutRefs );
    return vEdges;
}